

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring_bitmap_get_cardinality(roaring_bitmap_t *r)

{
  void **ppvVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  run_container_t *run;
  uint64_t uVar8;
  long lVar9;
  
  lVar9 = (long)(r->high_low_container).size;
  uVar8 = 0;
  if (0 < lVar9) {
    ppvVar1 = (r->high_low_container).containers;
    puVar2 = (r->high_low_container).typecodes;
    lVar6 = 0;
    do {
      run = (run_container_t *)ppvVar1[lVar6];
      uVar3 = puVar2[lVar6];
      if (uVar3 == '\x04') {
        uVar3 = *(uint8_t *)&run->runs;
        if (uVar3 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        run = *(run_container_t **)run;
      }
      if (uVar3 == '\x03') {
        lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar5 + 4) & 0x20) == 0) {
          iVar4 = run->n_runs;
          lVar5 = (long)iVar4;
          if (0 < lVar5) {
            lVar7 = 0;
            do {
              iVar4 = iVar4 + (uint)run->runs[lVar7].length;
              lVar7 = lVar7 + 1;
            } while (lVar5 != lVar7);
          }
        }
        else {
          iVar4 = _avx2_run_container_cardinality(run);
        }
      }
      else {
        if ((uVar3 != '\x02') && (uVar3 != '\x01')) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
        }
        iVar4 = run->n_runs;
      }
      uVar8 = uVar8 + (long)iVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar9);
  }
  return uVar8;
}

Assistant:

uint64_t roaring_bitmap_get_cardinality(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    uint64_t card = 0;
    for (int i = 0; i < ra->size; ++i)
        card += container_get_cardinality(ra->containers[i], ra->typecodes[i]);
    return card;
}